

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FLog.cpp
# Opt level: O0

void FLog::mUserLog(time_t dateTime,string *userName,int line,string *function,string *file,
                   string *text)

{
  id __id;
  char *pcVar1;
  long lVar2;
  ostream *this;
  string local_688;
  allocator<char> local_661;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  allocator<char> local_5d9;
  string local_5d8;
  UserLog local_5b8;
  undefined1 local_4f8 [8];
  mutex locker;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_230 [8];
  string temp;
  undefined1 local_208 [8];
  string timeTemp;
  string threadIdStr;
  ostringstream local_1b0 [8];
  ostringstream sstream;
  string *text_local;
  string *file_local;
  string *function_local;
  int line_local;
  string *userName_local;
  time_t dateTime_local;
  
  userName_local = (string *)dateTime;
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  __id = std::this_thread::get_id();
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1b0,__id);
  std::__cxx11::ostringstream::str();
  if (logLevel != none) {
    if ((printUser & 1U) != 0 || (printAll & 1U) != 0) {
      pcVar1 = ctime((time_t *)&userName_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_208,pcVar1,(allocator<char> *)(temp.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(temp.field_2._M_local_buf + 0xf));
      lVar2 = std::__cxx11::string::size();
      std::__cxx11::string::replace((ulong)local_208,lVar2 - 1,(char *)0x1);
      std::operator+(&local_4b0," [DateTime: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208)
      ;
      std::operator+(&local_490,&local_4b0," ] ");
      std::operator+(&local_470,&local_490," [Type: User    ] ");
      std::operator+(&local_450,&local_470," [Line: ");
      std::__cxx11::to_string
                ((string *)&locker.super___mutex_base._M_mutex.__data.__list.__next,line);
      std::operator+(&local_430,&local_450,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &locker.super___mutex_base._M_mutex.__data.__list.__next);
      std::operator+(&local_410,&local_430," ] ");
      std::operator+(&local_3f0,&local_410," [Function: ");
      std::operator+(&local_3d0,&local_3f0,function);
      std::operator+(&local_3b0,&local_3d0," ] ");
      std::operator+(&local_390,&local_3b0," [Thread Id: ");
      std::operator+(&local_370,&local_390,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&timeTemp.field_2 + 8));
      std::operator+(&local_350,&local_370," ] ");
      std::operator+(&local_330,&local_350," [File: ");
      std::operator+(&local_310,&local_330,file);
      std::operator+(&local_2f0,&local_310," ] ");
      std::operator+(&local_2d0,&local_2f0," [User: ");
      std::operator+(&local_2b0,&local_2d0,userName);
      std::operator+(&local_290,&local_2b0," ] ");
      std::operator+(&local_270,&local_290," [MSG: ");
      std::operator+(&local_250,&local_270,text);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                     &local_250," ] ");
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string
                ((string *)&locker.super___mutex_base._M_mutex.__data.__list.__next);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::mutex::mutex((mutex *)local_4f8);
      std::mutex::lock((mutex *)local_4f8);
      this = std::operator<<((ostream *)&std::clog,(string *)local_230);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      std::mutex::unlock((mutex *)local_4f8);
      std::__cxx11::string::~string((string *)local_230);
      std::__cxx11::string::~string((string *)local_208);
    }
    pcVar1 = ctime((time_t *)&userName_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d8,pcVar1,&local_5d9);
    std::__cxx11::to_string(&local_600,line);
    std::__cxx11::string::string((string *)&local_620,(string *)file);
    std::__cxx11::string::string((string *)&local_640,(string *)text);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,"user",&local_661);
    std::__cxx11::string::string((string *)&local_688,(string *)userName);
    FONQRI::UserLog::UserLog
              (&local_5b8,&local_5d8,&local_600,&local_620,&local_640,&local_660,&local_688);
    std::vector<FONQRI::UserLog,_std::allocator<FONQRI::UserLog>_>::push_back
              (&userLogList,&local_5b8);
    FONQRI::UserLog::~UserLog(&local_5b8);
    std::__cxx11::string::~string((string *)&local_688);
    std::__cxx11::string::~string((string *)&local_660);
    std::allocator<char>::~allocator(&local_661);
    std::__cxx11::string::~string((string *)&local_640);
    std::__cxx11::string::~string((string *)&local_620);
    std::__cxx11::string::~string((string *)&local_600);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::allocator<char>::~allocator(&local_5d9);
    std::vector<FONQRI::UserLog,_std::allocator<FONQRI::UserLog>_>::size(&userLogList);
  }
  std::__cxx11::string::~string((string *)(timeTemp.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return;
}

Assistant:

void FLog::mUserLog(std::time_t dateTime, std::string userName, int line,
			std::string function, std::string file, std::string text)
{

	// get thread id and convert it to string
	std::ostringstream sstream;
	sstream << std::this_thread::get_id();
	std::string threadIdStr = sstream.str();

	if (logLevel != FLog::none) {
		if (FLog::printUser | FLog::printAll) {
			std::string timeTemp = std::string(std::ctime(&dateTime));
			timeTemp.replace(timeTemp.size() - 1, 1, "");
			std::string temp =
			" [DateTime: " + timeTemp + " ] " +
			" [Type: User    ] " + " [Line: " +
			std::to_string(line) + " ] " + " [Function: " +
			function + " ] " + " [Thread Id: " + threadIdStr +
			" ] " + " [File: " + file + " ] " + " [User: " +
			userName + " ] " + " [MSG: " + text + " ] ";
			std::mutex locker;
			locker.lock();
			std::clog << temp << std::endl;
			locker.unlock();
		}
		FLog::userLogList.push_back(FONQRI::UserLog(
		std::string(std::ctime(&dateTime)), std::to_string(line), file,
		text, "user", userName));
		if (FLog::userLogList.size() >= FLog::userLogCounts) {
			// NOTE you can save save userLogList  to database
		}
	}
}